

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiViewport * ImGui::FindViewportByID(ImGuiID id)

{
  ImGuiContext_conflict *pIVar1;
  ImGuiViewportP_conflict1 **ppIVar2;
  int local_24;
  int n;
  ImGuiContext_conflict *g;
  ImGuiID id_local;
  
  pIVar1 = GImGui;
  local_24 = 0;
  while( true ) {
    if ((pIVar1->Viewports).Size <= local_24) {
      return (ImGuiViewport *)0x0;
    }
    ppIVar2 = ImVector<ImGuiViewportP_*>::operator[](&pIVar1->Viewports,local_24);
    if (((*ppIVar2)->super_ImGuiViewport).ID == id) break;
    local_24 = local_24 + 1;
  }
  ppIVar2 = ImVector<ImGuiViewportP_*>::operator[](&pIVar1->Viewports,local_24);
  return &(*ppIVar2)->super_ImGuiViewport;
}

Assistant:

ImGuiViewport* ImGui::FindViewportByID(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    for (int n = 0; n < g.Viewports.Size; n++)
        if (g.Viewports[n]->ID == id)
            return g.Viewports[n];
    return NULL;
}